

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcCircleHollowProfileDef::~IfcCircleHollowProfileDef
          (IfcCircleHollowProfileDef *this)

{
  code *pcVar1;
  _func_int *p_Var2;
  void *pvVar3;
  
  p_Var2 = (this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>._vptr_ObjectHelper[-3];
  pcVar1 = p_Var2 + 0x10 +
           (long)&(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.
                  super_IfcProfileDef.ProfileName.ptr._M_dataplus;
  *(undefined8 *)(pcVar1 + -0x40) = 0x90feb8;
  *(undefined8 *)(pcVar1 + 0x60) = 0x90fee0;
  if (*(code **)(pcVar1 + -0x10) != pcVar1) {
    operator_delete(*(code **)(pcVar1 + -0x10));
  }
  pvVar3 = *(void **)(&(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.
                       super_IfcProfileDef.
                       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x10 +
                     (long)p_Var2);
  if ((undefined1 *)pvVar3 !=
      &(this->super_IfcCircleProfileDef).super_IfcParameterizedProfileDef.super_IfcProfileDef.
       super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20 + (long)p_Var2) {
    operator_delete(pvVar3);
    return;
  }
  return;
}

Assistant:

IfcCircleHollowProfileDef() : Object("IfcCircleHollowProfileDef") {}